

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::FillExtensionToLanguageMap(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  ulong *puVar1;
  size_type *psVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pcVar5;
  undefined8 *puVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  pointer pbVar9;
  undefined8 uVar10;
  ulong uVar11;
  key_type *__k;
  string exts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string extensionsVar;
  string local_d8;
  undefined1 local_b8 [40];
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  pointer *local_50;
  long local_48;
  pointer local_40 [2];
  
  pbVar4 = (pointer)(local_b8 + 0x10);
  local_b8._0_8_ = pbVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CMAKE_","");
  pcVar5 = (l->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar5,pcVar5 + l->_M_string_length)
  ;
  pbVar3 = (pointer)((long)&((_Alloc_hider *)local_b8._8_8_)->_M_p + local_48);
  pbVar9 = (pointer)0xf;
  if ((pointer)local_b8._0_8_ != pbVar4) {
    pbVar9 = (pointer)local_b8._16_8_;
  }
  if (pbVar9 < pbVar3) {
    pbVar9 = (pointer)0xf;
    if (local_50 != local_40) {
      pbVar9 = local_40[0];
    }
    if (pbVar9 < pbVar3) goto LAB_003df5f1;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,local_b8._0_8_);
  }
  else {
LAB_003df5f1:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_b8,(ulong)local_50);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  puVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_d8.field_2._M_allocated_capacity = *puVar1;
    local_d8.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
    local_d8.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_d8.field_2._M_allocated_capacity = *puVar1;
    local_d8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_d8._M_string_length = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_SOURCE_FILE_EXTENSIONS","");
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    uVar10 = local_d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_68 + local_d8._M_string_length) {
    uVar11 = 0xf;
    if (local_70 != local_60) {
      uVar11 = local_60[0];
    }
    if (local_68 + local_d8._M_string_length <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
      goto LAB_003df6da;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_70);
LAB_003df6da:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar2 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar6[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_90._M_string_length = puVar6[1];
  *puVar6 = psVar2;
  puVar6[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(ulong)((long)&(local_40[0]->_M_dataplus)._M_p + 1));
  }
  if ((pointer)local_b8._0_8_ != pbVar4) {
    operator_delete((void *)local_b8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_b8._16_8_)->_M_p + 1));
  }
  pcVar7 = cmMakefile::GetSafeDefinition(mf,&local_90);
  std::__cxx11::string::string((string *)&local_d8,pcVar7,(allocator *)local_b8);
  local_b8._0_8_ = (key_type *)0x0;
  local_b8._8_8_ = (key_type *)0x0;
  local_b8._16_8_ = (pointer)0x0;
  cmSystemTools::ExpandListArgument
            (&local_d8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8,false);
  if (local_b8._0_8_ != local_b8._8_8_) {
    __k = (key_type *)local_b8._0_8_;
    do {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ExtensionToLanguage,__k);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      __k = __k + 1;
    } while (__k != (key_type *)local_b8._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  std::string exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(exts, extensionList);
  for (std::vector<std::string>::iterator i = extensionList.begin();
       i != extensionList.end(); ++i) {
    this->ExtensionToLanguage[*i] = l;
  }
}